

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_0::SharedRenderingPerfCase::deinit(SharedRenderingPerfCase *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  TestContext *pTVar3;
  pointer puVar4;
  deUint32 dVar5;
  Library *pLVar6;
  long lVar7;
  
  lVar7 = 0;
  while( true ) {
    ppTVar1 = (this->m_contexts).
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (this->m_contexts).
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppTVar2 - (long)ppTVar1) >> 3) <= lVar7) break;
    pTVar3 = ppTVar1[lVar7];
    if (pTVar3 != (TestContext *)0x0) {
      pLVar6 = EglTestContext::getLibrary(pTVar3->m_testCtx);
      (*pLVar6->_vptr_Library[0x27])
                (pLVar6,pTVar3->m_eglDisplay,pTVar3->m_eglSurface,pTVar3->m_eglSurface,
                 pTVar3->m_eglContext);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                       ,0x285);
      if ((pTVar3->m_parent == (TestContext *)0x0) && (pTVar3->m_eglImage != (EGLImageKHR)0x0)) {
        (*pLVar6->_vptr_Library[0x15])(pLVar6,pTVar3->m_eglDisplay);
        dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
        eglu::checkError(dVar5,"destroyImageKHR(m_eglDisplay, m_eglImage)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                         ,0x288);
      }
      (*pLVar6->_vptr_Library[0x27])(pLVar6,pTVar3->m_eglDisplay,0,0,0);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,
                       "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                       ,0x28a);
      (*pLVar6->_vptr_Library[0x13])(pLVar6,pTVar3->m_eglDisplay,pTVar3->m_eglContext);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"destroyContext(m_eglDisplay, m_eglContext)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                       ,0x28b);
      (*pLVar6->_vptr_Library[0x16])(pLVar6,pTVar3->m_eglDisplay,pTVar3->m_eglSurface);
      dVar5 = (*pLVar6->_vptr_Library[0x1f])(pLVar6);
      eglu::checkError(dVar5,"destroySurface(m_eglDisplay, m_eglSurface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                       ,0x28c);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&(pTVar3->m_indexData).
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&(pTVar3->m_coordData).super__Vector_base<float,_std::allocator<float>_>);
    }
    operator_delete(pTVar3,0x1ad8);
    (this->m_contexts).
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar7] = (TestContext *)0x0;
    lVar7 = lVar7 + 1;
  }
  if (ppTVar2 != ppTVar1) {
    (this->m_contexts).
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
  }
  puVar4 = (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar6 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar6->_vptr_Library[0x34])(pLVar6,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void SharedRenderingPerfCase::deinit (void)
{
	// Destroy resources and contexts
	for (int threadNdx = 0; threadNdx < (int)m_contexts.size(); threadNdx++)
	{
		delete m_contexts[threadNdx];
		m_contexts[threadNdx] = DE_NULL;
	}

	m_contexts.clear();
	m_results.clear();

	if (m_display != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
}